

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Product.h
# Opt level: O0

optional<covenant::DFA<covenant::Sym>_> * __thiscall
covenant::Product<covenant::Sym>::intersect_all
          (Product<covenant::Sym> *this,
          vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
          *reg_langs,uint alphstart,uint alphsz)

{
  int iVar1;
  size_type sVar2;
  void *pvVar3;
  ulong uVar4;
  size_type sVar5;
  ostream *poVar6;
  vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_> *in_RDX;
  optional<covenant::DFA<covenant::Sym>_> *in_RDI;
  bool bVar7;
  uint in_stack_000000c0;
  uint in_stack_000000c4;
  DFA<covenant::Sym> *in_stack_000000c8;
  optional<covenant::DFA<covenant::Sym>_> next;
  dfa_t reg_lang_i;
  uint i;
  dfa_t prev;
  bool result;
  optional<covenant::DFA<covenant::Sym>_> inter;
  dfa_t reg_lang_1;
  dfa_t reg_lang_0;
  reference_type in_stack_fffffffffffffbb8;
  DFA<covenant::Sym> *in_stack_fffffffffffffbc0;
  ostream *in_stack_fffffffffffffbc8;
  ostream *in_stack_fffffffffffffbd0;
  DFA<covenant::Sym> *in_stack_fffffffffffffbe8;
  DFA<covenant::Sym> *in_stack_fffffffffffffbf0;
  allocator *paVar8;
  int local_37c;
  undefined1 local_378 [8];
  dfa_t *in_stack_fffffffffffffc90;
  dfa_t *in_stack_fffffffffffffc98;
  allocator local_2f9;
  string local_2f8 [148];
  uint local_264;
  byte local_1e9;
  undefined1 local_1e8 [125];
  byte local_16b;
  byte local_16a;
  allocator local_169;
  string local_168 [37];
  byte local_143;
  byte local_142;
  allocator local_141;
  string local_140 [280];
  vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_> *local_28;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_28 = in_RDX;
  std::vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>::
  operator[](in_RDX,0);
  DFA<covenant::Sym>::makeDFA(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0);
  std::vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>::
  operator[](local_28,1);
  DFA<covenant::Sym>::makeDFA(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0);
  local_142 = 0;
  local_143 = 0;
  bVar7 = false;
  if ((avy::AvyLogFlag & 1) != 0) {
    std::allocator<char>::allocator();
    local_142 = 1;
    std::__cxx11::string::string(local_140,"verbose",&local_141);
    local_143 = 1;
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffbd0,(key_type *)in_stack_fffffffffffffbc8);
    bVar7 = sVar2 != 0;
  }
  if ((local_143 & 1) != 0) {
    std::__cxx11::string::~string(local_140);
  }
  if ((local_142 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
  }
  if (bVar7) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Automata 0 has ");
    iVar1 = DFA<covenant::Sym>::nStates((DFA<covenant::Sym> *)0x1f557c);
    pvVar3 = (void *)std::ostream::operator<<(poVar6,iVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  local_16a = 0;
  local_16b = 0;
  bVar7 = false;
  if ((avy::AvyLogFlag & 1) != 0) {
    std::allocator<char>::allocator();
    local_16a = 1;
    std::__cxx11::string::string(local_168,"verbose",&local_169);
    local_16b = 1;
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffbd0,(key_type *)in_stack_fffffffffffffbc8);
    bVar7 = sVar2 != 0;
  }
  if ((local_16b & 1) != 0) {
    std::__cxx11::string::~string(local_168);
  }
  if ((local_16a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  if (bVar7) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Automata 1 has ");
    iVar1 = DFA<covenant::Sym>::nStates((DFA<covenant::Sym> *)0x1f574e);
    pvVar3 = (void *)std::ostream::operator<<(poVar6,iVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  DFA<covenant::Sym>::intersection(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  local_8 = local_1e8;
  bVar7 = boost::optional<covenant::DFA<covenant::Sym>_>::operator!
                    ((optional<covenant::DFA<covenant::Sym>_> *)0x1f5819);
  local_1e9 = bVar7 - 1U & 1;
  if (local_1e9 != 0) {
    boost::optional<covenant::DFA<covenant::Sym>_>::operator*
              ((optional<covenant::DFA<covenant::Sym>_> *)0x1f583f);
    DFA<covenant::Sym>::DFA(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    for (local_264 = 2; uVar4 = (ulong)local_264,
        sVar5 = std::
                vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                ::size(local_28), uVar4 < sVar5; local_264 = local_264 + 1) {
      std::vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>::
      operator[](local_28,(ulong)local_264);
      DFA<covenant::Sym>::makeDFA(in_stack_000000c8,in_stack_000000c4,in_stack_000000c0);
      bVar7 = false;
      if ((avy::AvyLogFlag & 1) != 0) {
        paVar8 = &local_2f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2f8,"verbose",paVar8);
        sVar2 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffbd0,(key_type *)in_stack_fffffffffffffbc8);
        bVar7 = sVar2 != 0;
        std::__cxx11::string::~string(local_2f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      }
      if (bVar7) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Automata ");
        in_stack_fffffffffffffbd0 = (ostream *)std::ostream::operator<<(poVar6,local_264);
        in_stack_fffffffffffffbc8 = std::operator<<(in_stack_fffffffffffffbd0," has ");
        iVar1 = DFA<covenant::Sym>::nStates((DFA<covenant::Sym> *)0x1f59f1);
        in_stack_fffffffffffffbc0 =
             (DFA<covenant::Sym> *)std::ostream::operator<<(in_stack_fffffffffffffbc8,iVar1);
        std::ostream::operator<<(in_stack_fffffffffffffbc0,std::endl<char,std::char_traits<char>>);
      }
      DFA<covenant::Sym>::intersection(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
      local_10 = local_378;
      bVar7 = boost::optional<covenant::DFA<covenant::Sym>_>::operator!
                        ((optional<covenant::DFA<covenant::Sym>_> *)0x1f5b0a);
      local_1e9 = (local_1e9 & 1 & bVar7 - 1U & 1) != 0;
      if ((bool)local_1e9) {
        in_stack_fffffffffffffbb8 =
             boost::optional<covenant::DFA<covenant::Sym>_>::operator*
                       ((optional<covenant::DFA<covenant::Sym>_> *)0x1f5b52);
        DFA<covenant::Sym>::operator=(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
        local_37c = 0;
      }
      else {
        local_37c = 6;
      }
      boost::optional<covenant::DFA<covenant::Sym>_>::~optional
                ((optional<covenant::DFA<covenant::Sym>_> *)0x1f5b83);
      DFA<covenant::Sym>::~DFA(in_stack_fffffffffffffbc0);
      if (local_37c != 0) break;
    }
    bVar7 = (local_1e9 & 1) != 0;
    if (bVar7) {
      boost::optional<covenant::DFA<covenant::Sym>_>::optional
                ((optional<covenant::DFA<covenant::Sym>_> *)in_stack_fffffffffffffbc0,
                 in_stack_fffffffffffffbb8);
    }
    DFA<covenant::Sym>::~DFA(in_stack_fffffffffffffbc0);
    if (bVar7) goto LAB_001f5c63;
  }
  boost::optional<covenant::DFA<covenant::Sym>_>::optional
            ((optional<covenant::DFA<covenant::Sym>_> *)0x1f5c58);
LAB_001f5c63:
  boost::optional<covenant::DFA<covenant::Sym>_>::~optional
            ((optional<covenant::DFA<covenant::Sym>_> *)0x1f5c70);
  DFA<covenant::Sym>::~DFA(in_stack_fffffffffffffbc0);
  DFA<covenant::Sym>::~DFA(in_stack_fffffffffffffbc0);
  return in_RDI;
}

Assistant:

boost::optional<dfa_t> intersect_all(const vector<dfa_t>& reg_langs, 
                                       unsigned int alphstart, 
                                       unsigned int alphsz)
  {
    dfa_t reg_lang_0 = reg_langs[0].makeDFA (alphstart, alphsz);
    dfa_t reg_lang_1 = reg_langs[1].makeDFA (alphstart, alphsz);

    LOG("verbose", std::cout << "Automata 0 has " << reg_lang_0.nStates() << endl);
    LOG("verbose", std::cout << "Automata 1 has " << reg_lang_1.nStates() << endl);

    boost::optional<dfa_t> inter  = dfa_t::intersection(reg_lang_0, reg_lang_1);
    bool result = (inter ? true : false);
    if (result)
    {
      dfa_t prev = *inter;

      for(unsigned int i=2; i < reg_langs.size(); i++)
      {
        dfa_t reg_lang_i = reg_langs[i].makeDFA (alphstart, alphsz);

        LOG ("verbose", 
             cout << "Automata " << i << " has " << reg_lang_i.nStates() << endl);

        boost::optional<dfa_t> next = dfa_t::intersection(prev, reg_lang_i);

        result &= (next ? true : false);

        if (!result)
          break;
        
        prev = *next;
      }

      if (result)
        return boost::optional<dfa_t> (prev);
    }
    return boost::optional<dfa_t> ();
  }